

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeForwardDirconCut(Of_Man_t *p,int iObj,int *pCut,int *pDelay1,int *pDelay2)

{
  int iVar1;
  undefined8 uVar2;
  Of_Obj_t *pOVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int Delays [6];
  int Perm [6];
  uint local_7c [7];
  Jf_Par_t *local_60;
  int local_58 [8];
  ulong local_38;
  
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  local_58[3] = 3;
  local_58[4] = 4;
  local_58[5] = 5;
  local_60 = p->pPars;
  iVar1 = local_60->nDelayLut1;
  local_7c[0] = local_60->nDelayLut2;
  uVar12 = 0;
  uVar6 = *pCut & 0x1f;
  if (uVar6 != 0) {
    do {
      uVar7 = pCut[uVar12 + 1];
      if ((int)uVar7 < 0) goto LAB_0079a0c5;
      if (uVar7 < 2) goto LAB_00799d11;
      local_7c[uVar12 + 1] = p->pObjs[uVar7 >> 1].Delay1 + iVar1;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
    uVar12 = (ulong)uVar6;
  }
LAB_00799d11:
  if ((int)uVar12 < local_60->nLutSize) {
    uVar12 = uVar12 & 0xffffffff;
    lVar15 = (uint)local_60->nLutSize - uVar12;
    lVar16 = lVar15 + -1;
    auVar20._8_4_ = (int)lVar16;
    auVar20._0_8_ = lVar16;
    auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar19 = 0;
    auVar20 = auVar20 ^ _DAT_0094e250;
    do {
      auVar22._8_4_ = (int)uVar19;
      auVar22._0_8_ = uVar19;
      auVar22._12_4_ = (int)(uVar19 >> 0x20);
      auVar23 = (auVar22 | _DAT_0094e240) ^ _DAT_0094e250;
      iVar21 = auVar20._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar21 && auVar20._0_4_ < auVar23._0_4_ ||
                  iVar21 < auVar23._4_4_) & 1)) {
        local_7c[uVar12 + uVar19 + 1] = 0xc4653600;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        local_7c[uVar12 + uVar19 + 2] = 0xc4653600;
      }
      auVar22 = (auVar22 | _DAT_0094f530) ^ _DAT_0094e250;
      iVar11 = auVar22._4_4_;
      if (iVar11 <= iVar21 && (iVar11 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
        local_7c[uVar12 + uVar19 + 3] = 0xc4653600;
        local_7c[uVar12 + uVar19 + 4] = 0xc4653600;
      }
      uVar19 = uVar19 + 4;
    } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar19);
  }
  uVar12 = (ulong)uVar6;
  if (1 < uVar6) {
    uVar13 = 1;
    uVar19 = 0;
    do {
      uVar8 = uVar19 & 0xffffffff;
      uVar17 = uVar13;
      do {
        uVar5 = uVar17 & 0xffffffff;
        if ((int)local_7c[uVar17 + 1] <= (int)local_7c[(long)(int)uVar8 + 1]) {
          uVar5 = uVar8;
        }
        uVar8 = uVar5;
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
      iVar21 = local_58[uVar19];
      lVar15 = (long)(int)uVar8;
      local_58[uVar19] = local_58[lVar15];
      uVar7 = local_7c[uVar19 + 1];
      local_7c[uVar19 + 1] = local_7c[lVar15 + 1];
      uVar19 = uVar19 + 1;
      local_58[lVar15] = iVar21;
      local_7c[lVar15 + 1] = uVar7;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar6 - 1);
    if ((int)local_7c[1] < (int)local_7c[(ulong)(uVar6 - 1) + 1]) {
      __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                    ,0x52b,
                    "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
    }
  }
  if (((int)local_7c[1] < 0) || ((int)local_7c[uVar12] < 0)) {
    __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x52c,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  uVar7 = 0;
  *pDelay2 = 0;
  *pDelay1 = 0;
  if (local_60->nFastEdges < (int)uVar6) {
    uVar7 = local_7c[(long)local_60->nFastEdges + 1];
  }
  if (uVar6 == 0) {
    uVar10 = *pDelay2;
    uVar7 = 0;
    if (-1 < (int)uVar10) goto LAB_0079a038;
  }
  else {
    local_38 = (ulong)uVar6;
    bVar4 = true;
    uVar19 = 0;
    do {
      uVar18 = pCut[(long)local_58[uVar19] + 1];
      if ((int)uVar18 < 0) goto LAB_0079a0c5;
      uVar14 = uVar18 >> 1;
      uVar10 = local_7c[uVar19 + 1];
      if (uVar10 != p->pObjs[uVar14].Delay1 + iVar1) {
        __assert_fail("Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                      ,0x53a,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      if (((((long)uVar19 < (long)local_60->nFastEdges) && ((int)uVar7 < (int)uVar10)) && (bVar4))
         && (uVar9 = p->pObjs[uVar14].Delay2 + local_7c[0], (int)uVar9 < (int)uVar10)) {
        if (p->pGia->nObjs <= (int)uVar14) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar2 = *(undefined8 *)(p->pGia->pObjs + uVar14);
        uVar14 = (uint)uVar2;
        if (((~uVar14 & 0x1fffffff) == 0 || (int)uVar14 < 0) ||
           ((((uint)((ulong)uVar2 >> 0x20) ^ uVar14) & 0x1fffffff) == 0)) goto LAB_00799fc1;
        uVar18 = uVar18 | 1;
        bVar4 = true;
      }
      else {
LAB_00799fc1:
        uVar18 = uVar18 & 0x7ffffffe;
        bVar4 = false;
        uVar9 = uVar10;
      }
      pCut[(long)local_58[uVar19] + 1] = uVar18;
      if ((int)uVar9 < *pDelay1) {
        uVar9 = *pDelay1;
      }
      *pDelay1 = uVar9;
      if ((int)uVar10 < *pDelay2) {
        uVar10 = *pDelay2;
      }
      *pDelay2 = uVar10;
      uVar19 = uVar19 + 1;
    } while (uVar12 != uVar19);
    uVar7 = *pDelay1;
    if ((int)uVar7 <= (int)uVar10) goto LAB_0079a038;
    if (uVar6 != 0) {
      uVar19 = 0;
      do {
        if (pCut[uVar19 + 1] < 0) goto LAB_0079a0c5;
        pCut[uVar19 + 1] = pCut[uVar19 + 1] & 0x7ffffffe;
        uVar19 = uVar19 + 1;
      } while (uVar12 != uVar19);
      uVar10 = *pDelay2;
    }
  }
  uVar7 = uVar10;
  *pDelay1 = uVar7;
  uVar10 = *pDelay2;
LAB_0079a038:
  if ((int)uVar10 < (int)uVar7) {
    __assert_fail("*pDelay1 <= *pDelay2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x553,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  uVar6 = *pCut & 0x1f;
  pCut[(ulong)uVar6 + 1] = uVar7;
  iVar21 = *pDelay2;
  pCut[(ulong)uVar6 + 2] = iVar21;
  if (uVar6 != 0) {
    uVar12 = 0;
    do {
      uVar7 = pCut[uVar12 + 1];
      if ((int)uVar7 < 0) {
LAB_0079a0c5:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar7 < 2) {
        return;
      }
      uVar10 = uVar7 >> 1;
      pOVar3 = p->pObjs;
      if ((uVar7 & 1) == 0) {
        iVar11 = pOVar3[uVar10].Delay1 + iVar1;
        if (*pDelay1 < iVar11) {
          __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                        ,0x55c,
                        "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
        }
      }
      else {
        if (*pDelay1 < (int)(pOVar3[uVar10].Delay2 + local_7c[0])) {
          __assert_fail("Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                        ,0x55a,
                        "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
        }
        iVar11 = pOVar3[uVar10].Delay1 + iVar1;
      }
      if (iVar21 < iVar11) {
        __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                      ,0x55d,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  return;
}

Assistant:

void Of_ManComputeForwardDirconCut( Of_Man_t * p, int iObj, int * pCut, int * pDelay1, int * pDelay2 )
{
    // Delay1 - main delay;  Delay2 - precomputed LUT delay in terms of Delay1 for the fanins
    int Delays[6], Perm[6] = {0, 1, 2, 3, 4, 5}; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int DelayLut2 = p->pPars->nDelayLut2;
    int nSize = Of_CutSize(pCut);
    int k, iVar, Flag, SlowCon, Delay, DelayAfter, fDirConWorks;
    Of_CutForEachVar( pCut, iVar, k )
    {
        Delays[k] = Of_ObjDelay1(p, iVar) + DelayLut1;
//        printf( "%3d%s ", iVar, Flag ? "*" : " " );
    }
    for ( ; k < p->pPars->nLutSize; k++ )
    {
        Delays[k] = -ABC_INFINITY;
//        printf( "     " );
    }
    Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
    assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
    assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
    // consider speedup due to dircons
    fDirConWorks = 1;
    *pDelay1 = *pDelay2 = 0;
    SlowCon = p->pPars->nFastEdges < nSize ? Delays[p->pPars->nFastEdges] : 0;
    for ( k = 0; k < nSize; k++ )
    {
        // use dircon if the following is true
        // - the input is eligible for dircon (does not exceed the limit)
        // - there is an expected gain in delay, compared the largest delay without dircon
        // - the dircon delay is indeed lower than the largest delay without dircon
        // - all previous dircons worked out well
        // - the node is an AND-gate 
        iVar = Of_CutVar( pCut, Perm[k] );
        assert( Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1 );
        DelayAfter = Of_ObjDelay2(p, iVar) + DelayLut2;
        if ( k < p->pPars->nFastEdges && Delays[k] > SlowCon && DelayAfter < Delays[k] && fDirConWorks && Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, iVar)) )
        {
            Delay = DelayAfter;
            Of_CutSetFlag( pCut, Perm[k], 1 );
        }
        else
        {
            Delay = Delays[k];// + DelayLut2;
            Of_CutSetFlag( pCut, Perm[k], 0 );
            fDirConWorks = 0;
        }
        *pDelay1 = Abc_MaxInt( *pDelay1, Delay );
        *pDelay2 = Abc_MaxInt( *pDelay2, Delays[k] );
    }
//    printf( "   %5.2f",   Of_Int2Flt(*pDelay1) );
//    printf( "   %5.2f\n", Of_Int2Flt(*pDelay2) );
    // do not use the structure if simple LUT is better
    if ( *pDelay1 > *pDelay2 )
    {
        for ( k = 0; k < nSize; k++ )
            Of_CutSetFlag( pCut, k, 0 );
        *pDelay1 = *pDelay2;
    }
    assert( *pDelay1 <= *pDelay2 );
    Of_CutSetDelay1( pCut, *pDelay1 );
    Of_CutSetDelay2( pCut, *pDelay2 );
    // verify
    Of_CutForEachVarFlag( pCut, iVar, Flag, k )
    {
        if ( Flag )
            assert( Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1 );
        else
            assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1 );
        assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2 );
    }
}